

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DefaultOrderSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  bool bVar1;
  InvalidInputException *this;
  OrderType OVar2;
  allocator local_79;
  string parameter;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Value::ToString_abi_cxx11_(&local_58,input);
  StringUtil::Lower(&parameter,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  bVar1 = ::std::operator==(&parameter,"ascending");
  OVar2 = ASCENDING;
  if (!bVar1) {
    bVar1 = ::std::operator==(&parameter,"asc");
    if (!bVar1) {
      bVar1 = ::std::operator==(&parameter,"descending");
      OVar2 = DESCENDING;
      if (!bVar1) {
        bVar1 = ::std::operator==(&parameter,"desc");
        if (!bVar1) {
          this = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,
                     "Unrecognized parameter for option DEFAULT_ORDER \"%s\". Expected ASC or DESC."
                     ,&local_79);
          ::std::__cxx11::string::string((string *)&local_38,(string *)&parameter);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (this,&local_58,&local_38);
          __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
  }
  (config->options).default_order_type = OVar2;
  ::std::__cxx11::string::~string((string *)&parameter);
  return;
}

Assistant:

void DefaultOrderSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());
	if (parameter == "ascending" || parameter == "asc") {
		config.options.default_order_type = OrderType::ASCENDING;
	} else if (parameter == "descending" || parameter == "desc") {
		config.options.default_order_type = OrderType::DESCENDING;
	} else {
		throw InvalidInputException("Unrecognized parameter for option DEFAULT_ORDER \"%s\". Expected ASC or DESC.",
		                            parameter);
	}
}